

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O0

string * __thiscall Json::GetParseJsonErrorStr_abi_cxx11_(Json *this,int errorCode)

{
  undefined4 in_EDX;
  string *in_RDI;
  allocator local_35;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d;
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [16];
  allocator local_15 [21];
  
  switch(in_EDX) {
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"The document is empty.",local_15);
    std::allocator<char>::~allocator((allocator<char> *)local_15);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (in_RDI,"The document root must not follow by other values.",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"Invalid value.",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"Missing a name for object member.",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"Missing a colon after a name of object member.",&local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_28);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (in_RDI,"Missing a comma or \'}\' after an object member.",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (in_RDI,"Missing a comma or \']\' after an array element.",&local_2a);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a);
    break;
  case 8:
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (in_RDI,"Incorrect hex digit after \\\\u escape in string.",&local_2b);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b);
    break;
  case 9:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"The surrogate pair in string is invalid.",&local_2c);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c);
    break;
  case 10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"Invalid escape character in string.",&local_2d);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d);
    break;
  case 0xb:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"Missing a closing quotation mark in string.",&local_2e);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e);
    break;
  case 0xc:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"Invalid encoding in string.",&local_2f);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f);
    break;
  case 0xd:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"Number too big to be stored in double.",&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_30);
    break;
  case 0xe:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"Miss fraction part in number.",&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    break;
  case 0xf:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"Miss exponent in number.",&local_32);
    std::allocator<char>::~allocator((allocator<char> *)&local_32);
    break;
  case 0x10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"Parsing was terminated.",&local_33);
    std::allocator<char>::~allocator((allocator<char> *)&local_33);
    break;
  case 0x11:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"Unspecific syntax error.",&local_34);
    std::allocator<char>::~allocator((allocator<char> *)&local_34);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"Unknown",&local_35);
    std::allocator<char>::~allocator((allocator<char> *)&local_35);
  }
  return in_RDI;
}

Assistant:

std::string GetParseJsonErrorStr(int errorCode)
    {
        switch (errorCode)
        {
            case kParseErrorDocumentEmpty:
                return "The document is empty.";
            case kParseErrorDocumentRootNotSingular:
                return "The document root must not follow by other values.";
            case kParseErrorValueInvalid:
                return "Invalid value.";
            case kParseErrorObjectMissName:
                return "Missing a name for object member.";
            case kParseErrorObjectMissColon:
                return "Missing a colon after a name of object member.";
            case kParseErrorObjectMissCommaOrCurlyBracket:
                return "Missing a comma or '}' after an object member.";
            case kParseErrorArrayMissCommaOrSquareBracket:
                return "Missing a comma or ']' after an array element.";
            case kParseErrorStringUnicodeEscapeInvalidHex:
                return "Incorrect hex digit after \\\\u escape in string.";
            case kParseErrorStringUnicodeSurrogateInvalid:
                return "The surrogate pair in string is invalid.";
            case kParseErrorStringEscapeInvalid:
                return "Invalid escape character in string.";
            case kParseErrorStringMissQuotationMark:
                return "Missing a closing quotation mark in string.";
            case kParseErrorStringInvalidEncoding:
                return "Invalid encoding in string.";
            case kParseErrorNumberTooBig:
                return "Number too big to be stored in double.";
            case kParseErrorNumberMissFraction:
                return "Miss fraction part in number.";
            case kParseErrorNumberMissExponent:
                return "Miss exponent in number.";
            case kParseErrorTermination:
                return "Parsing was terminated.";
            case kParseErrorUnspecificSyntaxError:
                return "Unspecific syntax error.";
            default:
                return "Unknown";
        }
    }